

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmetrohash64.c
# Opt level: O0

void cmetrohash64_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong *in_RCX;
  uint in_EDX;
  ulong in_RSI;
  void *in_RDI;
  uint64_t v1;
  uint64_t v0;
  uint64_t v [4];
  uint64_t hash;
  uint8_t *end;
  uint8_t *ptr;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  void *local_28;
  
  local_38 = ((ulong)in_EDX + 0x62992fc1) * 0xd6d018f5 + in_RSI;
  local_58 = local_38;
  local_50 = local_38;
  local_48 = local_38;
  local_40 = local_38;
  local_28 = in_RDI;
  if (0x1f < in_RSI) {
    do {
      uVar1 = cread_u64(local_28);
      uVar1 = crotate_right(uVar1 * 0xd6d018f5 + local_58,0x1d);
      local_58 = uVar1 + local_48;
      uVar1 = cread_u64((void *)((long)local_28 + 8));
      uVar1 = crotate_right(uVar1 * 0xa2aa033b + local_50,0x1d);
      local_50 = uVar1 + local_40;
      uVar1 = cread_u64((void *)((long)local_28 + 0x10));
      uVar1 = crotate_right(uVar1 * 0x62992fc1 + local_48,0x1d);
      uVar2 = cread_u64((void *)((long)local_28 + 0x18));
      local_28 = (void *)((long)local_28 + 0x20);
      uVar2 = crotate_right(uVar2 * 0x30bc5b29 + local_40,0x1d);
      local_40 = uVar2 + local_50;
      local_48 = uVar1 + local_58;
    } while (local_28 <= (void *)((long)in_RDI + (in_RSI - 0x20)));
    uVar2 = crotate_right((local_58 + local_40) * 0xd6d018f5 + local_50,0x1e);
    uVar3 = uVar2 * 0xa2aa033b ^ uVar1 + local_58;
    uVar1 = crotate_right((local_50 + uVar3) * 0xa2aa033b + local_58,0x1e);
    local_40 = uVar1 * 0xd6d018f5 ^ local_40;
    uVar1 = crotate_right((local_58 + uVar3) * 0xd6d018f5 + local_40,0x1e);
    uVar2 = crotate_right((local_50 + local_40) * 0xa2aa033b + uVar3,0x1e);
    local_38 = (uVar1 * 0xa2aa033b ^ local_58 ^ uVar2 * 0xd6d018f5 ^ local_50) + local_38;
  }
  if (0xf < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = cread_u64(local_28);
    uVar1 = crotate_right(local_38 + uVar1 * 0x62992fc1,0x1d);
    uVar2 = cread_u64((void *)((long)local_28 + 8));
    local_28 = (void *)((long)local_28 + 0x10);
    uVar2 = crotate_right(local_38 + uVar2 * 0x62992fc1,0x1d);
    uVar4 = crotate_right(uVar1 * 0x28e511fea41f163d,0x22);
    uVar5 = crotate_right(uVar2 * 0x9472cc564ae2c91,0x22);
    local_38 = (uVar5 + (uVar4 + uVar2 * 0x30bc5b29 ^ uVar1 * 0x30bc5b29) ^ uVar2 * 0x30bc5b29) +
               local_38;
  }
  if (7 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = cread_u64(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    local_28 = (void *)((long)local_28 + 8);
    uVar2 = crotate_right(uVar1,0x24);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  if (3 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = cread_u32(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    local_28 = (void *)((long)local_28 + 4);
    uVar2 = crotate_right(uVar1,0xf);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  if (1 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = cread_u16(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    local_28 = (void *)((long)local_28 + 2);
    uVar2 = crotate_right(uVar1,0xf);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  if (0 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = cread_u8(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    uVar2 = crotate_right(uVar1,0x17);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  uVar1 = crotate_right(local_38,0x1c);
  uVar1 = (uVar1 ^ local_38) * 0xd6d018f5;
  uVar2 = crotate_right(uVar1,0x1d);
  *in_RCX = uVar2 ^ uVar1;
  return;
}

Assistant:

void cmetrohash64_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xD6D018F5;
    static const uint64_t k1 = 0xA2AA033B;
    static const uint64_t k2 = 0x62992FC1;
    static const uint64_t k3 = 0x30BC5B29; 

    const uint8_t * ptr = key;
    const uint8_t * const end = ptr + len;
    
    uint64_t hash = ((((uint64_t) seed) + k2) * k0) + len;
    
    if (len >= 32)
    {
        uint64_t v[4];
        v[0] = hash;
        v[1] = hash;
        v[2] = hash;
        v[3] = hash;
        
        do
        {
            v[0] += cread_u64(ptr) * k0; ptr += 8; v[0] = crotate_right(v[0],29) + v[2];
            v[1] += cread_u64(ptr) * k1; ptr += 8; v[1] = crotate_right(v[1],29) + v[3];
            v[2] += cread_u64(ptr) * k2; ptr += 8; v[2] = crotate_right(v[2],29) + v[0];
            v[3] += cread_u64(ptr) * k3; ptr += 8; v[3] = crotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= crotate_right(((v[0] + v[3]) * k0) + v[1], 30) * k1;
        v[3] ^= crotate_right(((v[1] + v[2]) * k1) + v[0], 30) * k0;
        v[0] ^= crotate_right(((v[0] + v[2]) * k0) + v[3], 30) * k1;
        v[1] ^= crotate_right(((v[1] + v[3]) * k1) + v[2], 30) * k0;
        hash += v[0] ^ v[1];
    }
    
    if ((end - ptr) >= 16)
    {
        uint64_t v0 = hash + (cread_u64(ptr) * k2); ptr += 8; v0 = crotate_right(v0,29) * k3;
        uint64_t v1 = hash + (cread_u64(ptr) * k2); ptr += 8; v1 = crotate_right(v1,29) * k3;
        v0 ^= crotate_right(v0 * k0, 34) + v1;
        v1 ^= crotate_right(v1 * k3, 34) + v0;
        hash += v1;
    }
    
    if ((end - ptr) >= 8)
    {
        hash += cread_u64(ptr) * k3; ptr += 8;
        hash ^= crotate_right(hash, 36) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        hash += cread_u32(ptr) * k3; ptr += 4;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 2)
    {
        hash += cread_u16(ptr) * k3; ptr += 2;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        hash += cread_u8 (ptr) * k3;
        hash ^= crotate_right(hash, 23) * k1;
    }
    
    hash ^= crotate_right(hash, 28);
    hash *= k0;
    hash ^= crotate_right(hash, 29);

    memcpy(out, &hash, 8);
}